

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void formatter_suite::format_map_nested_map(void)

{
  iterator iVar1;
  iterator iVar2;
  basic_variable<std::allocator<char>_> *data_00;
  basic_variable<std::allocator<char>_> *local_350;
  basic_variable<std::allocator<char>_> *local_338;
  basic_variable<std::allocator<char>_> *local_320;
  type *local_308;
  basic_variable<std::allocator<char>_> *local_2f0;
  undefined5 local_2c0;
  undefined3 uStack_2bb;
  value_type expected [13];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  basic_variable<std::allocator<char>_> local_288;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 auStack_228 [32];
  basic_variable<std::allocator<char>_> local_208;
  undefined1 auStack_1d8 [32];
  type local_1b8;
  basic_variable<std::allocator<char>_> local_188;
  type local_158;
  nullable local_134;
  basic_variable<std::allocator<char>_> *local_130;
  basic_variable<std::allocator<char>_> local_128;
  basic_variable<std::allocator<char>_> local_f8;
  undefined1 auStack_c8 [32];
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  auStack_c8._24_8_ = &local_a8;
  local_130 = &local_128;
  local_134 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_130,&local_134);
  local_130 = &local_f8;
  local_158._16_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (local_130,(nullable *)(local_158.__data + 0x10));
  auStack_c8._8_8_ = &local_128;
  auStack_c8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_a8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_c8 + 8));
  auStack_1d8._24_8_ = &local_1b8;
  auStack_c8._24_8_ = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_1d8._24_8_,true);
  auStack_228._24_8_ = &local_208;
  auStack_1d8._24_8_ = &local_188;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_288,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_258,3.0);
  auStack_228._8_8_ = &local_288;
  auStack_228._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_208,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_228 + 8));
  auStack_1d8._8_8_ = &local_208;
  auStack_1d8._16_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_188,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_1d8 + 8));
  local_158._0_8_ = &local_1b8;
  local_158._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_78,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             &local_158.__align);
  local_48._0_8_ = &local_a8;
  local_48._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_2f0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_2f0 = local_2f0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2f0);
  } while (local_2f0 != &local_a8);
  local_308 = &local_158;
  do {
    local_308 = (type *)((long)local_308 + -0x30);
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
              ((basic_variable<std::allocator<char>_> *)&local_308->__align);
  } while (local_308 != &local_1b8);
  local_320 = (basic_variable<std::allocator<char>_> *)auStack_1d8;
  do {
    local_320 = local_320 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_320);
  } while (local_320 != &local_208);
  local_338 = (basic_variable<std::allocator<char>_> *)auStack_228;
  do {
    local_338 = local_338 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_338);
  } while (local_338 != &local_288);
  local_350 = (basic_variable<std::allocator<char>_> *)auStack_c8;
  do {
    local_350 = local_350 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_350);
  } while (local_350 != &local_128);
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 8),
             (bintoken *)local_38,data_00);
  expected[0] = '\0';
  expected[1] = '@';
  expected[2] = '@';
  expected[3] = 0x9f;
  expected[4] = 0x9f;
  local_2c0 = 0x9e8182829e;
  uStack_2bb = 0xc502;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 8));
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 8));
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x197,"void formatter_suite::format_map_nested_map()",iVar1._M_current,
             iVar2._M_current,&local_2c0,expected + 5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void format_map_nested_map()
{
    variable data =
        {
            { null, null },
            { true, {{ 2, 3.0f }} }
        };
    auto result = bintoken::format<buffer_type>(data);
    const value_type expected[] = {
        bintoken::token::code::begin_assoc_array,
        bintoken::token::code::null,
        bintoken::token::code::null,
        bintoken::token::code::true_value,
        bintoken::token::code::begin_assoc_array,
        0x02,
        bintoken::token::code::float32, 0x00, 0x00, 0x40, 0x40,
        bintoken::token::code::end_assoc_array,
        bintoken::token::code::end_assoc_array
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
}